

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

FADFADSTATE * FADsinh(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FADFADSTATE *resa;
  Fad<double> sinhval;
  Fad<double> coshval;
  FadExpr<FadFuncCosh<Fad<double>_>_> local_a8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_80;
  Fad<double> local_70;
  Fad<double> local_50;
  
  cosh<double>(&local_a8,&x->val_);
  Fad<double>::Fad<FadFuncCosh<Fad<double>>>(&local_50,&local_a8);
  Fad<double>::~Fad(&local_a8.fadexpr_.expr_);
  sinh<double>((FadExpr<FadFuncSinh<Fad<double>_>_> *)&local_a8,&x->val_);
  Fad<double>::Fad<FadFuncSinh<Fad<double>>>
            (&local_70,(FadExpr<FadFuncSinh<Fad<double>_>_> *)&local_a8);
  Fad<double>::~Fad(&local_a8.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_70);
  uVar1 = 0;
  uVar2 = (ulong)sz;
  if ((int)sz < 1) {
    uVar2 = uVar1;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    Fad<Fad<double>_>::dx((Fad<double> *)&local_a8,x,(int)uVar3);
    local_80.fadexpr_.left_ = &local_50;
    local_80.fadexpr_.right_ = (Fad<double> *)&local_a8;
    Fad<double>::operator=
              ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + uVar1),
               &local_80);
    Fad<double>::~Fad((Fad<double> *)&local_a8);
    uVar1 = uVar1 + 0x20;
  }
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADsinh(FADFADSTATE x)
{
    Fad<STATE> coshval = cosh(x.val());
    Fad<STATE> sinhval = sinh(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,sinhval);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = coshval*x.dx(i);
    }
    return resa;
}